

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextOutput.cpp
# Opt level: O3

void __thiscall Test::TextOutput::printFailure(TextOutput *this,Assertion *assertion)

{
  size_type sVar1;
  pointer pcVar2;
  ostream *poVar3;
  string local_48;
  
  poVar3 = this->stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Test \'",6);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(assertion->method)._M_dataplus._M_p,
                      (assertion->method)._M_string_length);
  local_48._M_dataplus._M_p._0_1_ = 0x28;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_48,1);
  sVar1 = (assertion->args)._M_string_length;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  if (sVar1 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  }
  else {
    pcVar2 = (assertion->args)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar2,pcVar2 + sVar1);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\' failed!",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  poVar3 = this->stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tSuite: ",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(assertion->suite)._M_dataplus._M_p,(assertion->suite)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  poVar3 = this->stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tFile: ",7);
  Private::getFileName(&local_48,&assertion->file);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  poVar3 = this->stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tLine: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((assertion->errorMessage)._M_string_length != 0) {
    poVar3 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tFailure: ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(assertion->errorMessage)._M_dataplus._M_p,
                        (assertion->errorMessage)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  if ((assertion->userMessage)._M_string_length != 0) {
    poVar3 = this->stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tMessage: ",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(assertion->userMessage)._M_dataplus._M_p,
                        (assertion->userMessage)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void TextOutput::printFailure(const Assertion &assertion) {
  stream << "Test '" << assertion.method << '(' << (assertion.args.empty() ? "" : assertion.args) << ")' failed!"
         << std::endl;
  stream << "\tSuite: " << assertion.suite << std::endl;
  stream << "\tFile: " << Private::getFileName(assertion.file) << std::endl;
  stream << "\tLine: " << assertion.lineNumber << std::endl;
  if (!assertion.errorMessage.empty())
    stream << "\tFailure: " << assertion.errorMessage << std::endl;
  if (!assertion.userMessage.empty())
    stream << "\tMessage: " << assertion.userMessage << std::endl;
}